

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O3

void __thiscall QStatusBar::removeWidget(QStatusBar *this,QWidget *widget)

{
  long lVar1;
  long *plVar2;
  ulong uVar3;
  int iVar4;
  ItemCategory IVar5;
  iterator aend;
  iterator iVar6;
  SBItem *pSVar7;
  SBItem *pSVar8;
  long *plVar9;
  long *plVar10;
  long lVar11;
  ulong uVar12;
  const_iterator abegin;
  QList<QStatusBarPrivate::SBItem> *this_00;
  
  if (widget == (QWidget *)0x0) {
    return;
  }
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  plVar2 = *(long **)(lVar1 + 0x260);
  uVar3 = *(ulong *)(lVar1 + 0x268);
  plVar10 = plVar2;
  uVar12 = uVar3;
  if (0 < (long)uVar3 >> 2) {
    plVar10 = (long *)((uVar3 * 0x10 & 0xffffffffffffffc0) + (long)plVar2);
    lVar11 = ((long)uVar3 >> 2) + 1;
    plVar9 = plVar2 + 4;
    do {
      if ((QWidget *)plVar9[-4] == widget) {
        plVar9 = plVar9 + -4;
        goto LAB_004875f6;
      }
      if ((QWidget *)plVar9[-2] == widget) {
        plVar9 = plVar9 + -2;
        goto LAB_004875f6;
      }
      if ((QWidget *)*plVar9 == widget) goto LAB_004875f6;
      if ((QWidget *)plVar9[2] == widget) {
        plVar9 = plVar9 + 2;
        goto LAB_004875f6;
      }
      lVar11 = lVar11 + -1;
      plVar9 = plVar9 + 8;
    } while (1 < lVar11);
    uVar12 = (ulong)((uint)uVar3 & 3);
  }
  if (uVar12 != 1) {
    if (uVar12 != 2) {
      plVar9 = plVar2 + uVar3 * 2;
      if ((uVar12 != 3) || (plVar9 = plVar10, (QWidget *)*plVar10 == widget)) goto LAB_004875f6;
      plVar10 = plVar10 + 2;
    }
    plVar9 = plVar10;
    if ((QWidget *)*plVar10 == widget) goto LAB_004875f6;
    plVar10 = plVar10 + 2;
  }
  plVar9 = plVar2 + uVar3 * 2;
  if ((QWidget *)*plVar10 == widget) {
    plVar9 = plVar10;
  }
LAB_004875f6:
  lVar11 = (long)plVar9 - (long)plVar2;
  if (lVar11 >> 4 != uVar3) {
    this_00 = (QList<QStatusBarPrivate::SBItem> *)(lVar1 + 600);
    aend = QList<QStatusBarPrivate::SBItem>::end(this_00);
    iVar6 = QList<QStatusBarPrivate::SBItem>::begin(this_00);
    abegin.i = iVar6.i + lVar11;
    pSVar7 = iVar6.i + lVar11;
    while (pSVar8 = pSVar7, pSVar7 = pSVar8 + 1, pSVar7 != aend.i) {
      if (pSVar7->widget != widget) {
        iVar4 = pSVar8[1].stretch;
        IVar5 = pSVar8[1].category;
        (abegin.i)->widget = pSVar7->widget;
        (abegin.i)->stretch = iVar4;
        (abegin.i)->category = IVar5;
        abegin.i = abegin.i + 1;
      }
    }
    QList<QStatusBarPrivate::SBItem>::erase(this_00,abegin,(const_iterator)aend.i);
    if (aend.i != abegin.i) {
      QWidget::hide(widget);
      reformat(this);
      return;
    }
  }
  return;
}

Assistant:

void QStatusBar::removeWidget(QWidget *widget)
{
    if (!widget)
        return;

    Q_D(QStatusBar);
    if (d->items.removeIf([widget](const auto &item) { return item.widget == widget; })) {
        widget->hide();
        reformat();
    }
#if defined(QT_DEBUG)
    else
        qDebug("QStatusBar::removeWidget(): Widget not found.");
#endif
}